

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O2

void __thiscall
Lodtalk::VMContext::executeScriptFromFile(VMContext *this,FILE *file,string *name,string *basePath)

{
  FILE *file_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  file_local = file;
  local_38._M_unused._M_object = operator_new(0x18);
  *(FILE ***)local_38._M_unused._0_8_ = &file_local;
  *(string **)((long)local_38._M_unused._0_8_ + 8) = name;
  *(string **)((long)local_38._M_unused._0_8_ + 0x10) = basePath;
  pcStack_20 = std::
               _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:48:21)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:48:21)>
             ::_M_manager;
  withInterpreter(this,(WithInterpreterBlock *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void VMContext::executeScriptFromFile(FILE *file, const std::string &name, const std::string &basePath)
{
    withInterpreter([&](InterpreterProxy *interpreter) {
        Lodtalk::executeScriptFromFile(interpreter, file, name, basePath);
    });
}